

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O1

void tonk::SetTonkAddressStr(TonkAddress *addrOut,UDPAddress *addrIn)

{
  uint16_t uVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  address ip_addr;
  string addrstr;
  address local_50;
  string local_30;
  
  uVar1 = swap_bytes((addrIn->impl_).data_.v4.sin_port);
  addrOut->UDPPort = uVar1;
  bVar4 = (addrIn->impl_).data_.base.sa_family != 2;
  if (bVar4) {
    local_50.ipv6_address_.addr_.__in6_u._0_8_ = *(long *)((long)&(addrIn->impl_).data_ + 8);
    local_50.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(addrIn->impl_).data_ + 0x10);
    local_50.ipv6_address_.scope_id_ = (unsigned_long)(addrIn->impl_).data_.v6.sin6_scope_id;
    local_50.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    local_50.ipv4_address_.addr_.s_addr = (in4_addr_type)(addrIn->impl_).data_.v6.sin6_flowinfo;
    local_50.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_50.ipv6_address_.scope_id_ = 0;
  }
  local_50.type_ = (anon_enum_32)bVar4;
  if (local_50.type_ == ipv4) {
    bVar4 = local_50.ipv4_address_.addr_.s_addr == 0;
  }
  else {
    if ((local_50.ipv6_address_.addr_.__in6_u._0_8_ != 0) ||
       ((int)local_50.ipv6_address_.addr_.__in6_u._8_8_ != 0)) goto LAB_001525df;
    if ((local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] != '\0' ||
         local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] != '\0') ||
       (local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] != '\0')) goto LAB_001525df;
    bVar4 = local_50.ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] == '\0';
  }
  if (bVar4) {
    *(undefined1 (*) [32])addrOut->NetworkString = ZEXT832(0) << 0x20;
    addrOut->NetworkString[0x20] = '\0';
    addrOut->NetworkString[0x21] = '\0';
    addrOut->NetworkString[0x22] = '\0';
    addrOut->NetworkString[0x23] = '\0';
    addrOut->NetworkString[0x24] = '\0';
    addrOut->NetworkString[0x25] = '\0';
    addrOut->NetworkString[0x26] = '\0';
    addrOut->NetworkString[0x27] = '\0';
    return;
  }
LAB_001525df:
  asio::ip::address::to_string_abi_cxx11_(&local_30,&local_50);
  uVar2 = 0x27;
  if (local_30._M_string_length < 0x27) {
    uVar2 = local_30._M_string_length;
  }
  if (local_30._M_string_length != 0) {
    uVar3 = 0;
    do {
      addrOut->NetworkString[uVar3] = local_30._M_dataplus._M_p[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  memset(addrOut->NetworkString + uVar2,0,0x28 - uVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetTonkAddressStr(TonkAddress& addrOut, const UDPAddress& addrIn)
{
    addrOut.UDPPort = addrIn.port();

    const auto ip_addr = addrIn.address();
    if (ip_addr.is_unspecified())
    {
        memset(addrOut.NetworkString, 0, sizeof(addrOut.NetworkString));
        return;
    }

    const std::string addrstr = ip_addr.to_string();

    size_t slen = addrstr.size();
    if (slen > TONK_IP_STRING_MAX_CHARS)
        slen = TONK_IP_STRING_MAX_CHARS;
    static_assert(sizeof(addrOut.NetworkString) == TONK_IP_STRING_BYTES, "Update this");

    for (size_t i = 0; i < slen; ++i)
        addrOut.NetworkString[i] = addrstr[i];
    for (size_t i = slen; i < TONK_IP_STRING_BYTES; ++i)
        addrOut.NetworkString[i] = '\0';
}